

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epd.c
# Opt level: O1

void EpdSubtract(EpDouble *epd1,double value)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  int __exponent;
  double dVar5;
  double dVar6;
  EpType val;
  
  if ((SUB84(epd1->type,4) >> 0x14 < 0xfff ||
       ((ulong)epd1->type & 0xfffffffffffff) != 0x8000000000000) &&
     (((ulong)value & 0xfffffffffffff) != 0x8000000000000 || (ulong)value < 0xfff0000000000000)) {
    uVar4 = (ulong)epd1->type & 0x7fffffffffffffff;
    dVar5 = ABS(value);
    uVar1 = (uint)((ulong)value >> 0x20);
    if (dVar5 != INFINITY && uVar4 != 0x7ff0000000000000) {
      if (((ulong)epd1->type & 0x7ff0000000000000) != 0x3ff0000000000000) {
        __assert_fail("epd1->type.bits.exponent == EPD_MAX_BIN",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/epd/epd.c"
                      ,0x2ed,"void EpdSubtract(EpDouble *, double)");
      }
      iVar2 = 0;
      if ((((ulong)value & 0x7ff7ffffffffffff) != 0x7ff0000000000000 ||
           ((ulong)value & 0x8008000000000000) == 0x8000000000000) &&
         (uVar1 = uVar1 >> 0x14 & 0x7ff, iVar2 = 0, uVar1 != 0x3ff)) {
        iVar2 = uVar1 - 0x3ff;
        value = (double)((ulong)value & 0x800fffffffffffff | 0x3ff0000000000000);
      }
      iVar3 = epd1->exponent;
      __exponent = iVar3 - iVar2;
      if (__exponent == 0 || iVar3 < iVar2) {
        if (iVar3 < iVar2) {
          if (iVar2 - iVar3 < 0x400) {
            dVar5 = (epd1->type).value;
            dVar6 = ldexp(1.0,iVar2 - iVar3);
            dVar5 = dVar5 / dVar6 - value;
            iVar3 = iVar2;
          }
          else {
            dVar5 = -value;
            iVar3 = iVar2;
          }
        }
        else {
          dVar5 = (epd1->type).value - value;
        }
      }
      else {
        dVar5 = (epd1->type).value;
        if (__exponent < 0x400) {
          dVar6 = ldexp(1.0,__exponent);
          dVar5 = dVar5 - value / dVar6;
        }
        iVar3 = epd1->exponent;
      }
      (epd1->type).value = dVar5;
      epd1->exponent = iVar3;
      EpdNormalize(epd1);
      return;
    }
    iVar2 = 0;
    if ((((ulong)value & 0x7ff7ffffffffffff) != 0x7ff0000000000000 ||
         ((ulong)value & 0x8008000000000000) == 0x8000000000000) &&
       (uVar1 = uVar1 >> 0x14 & 0x7ff, uVar1 != 0x3ff)) {
      iVar2 = uVar1 - 0x3ff;
      value = (double)((ulong)value & 0x800fffffffffffff | 0x3ff0000000000000);
    }
    if (dVar5 != INFINITY || uVar4 != 0x7ff0000000000000) {
      if (ABS(value) != INFINITY) {
        return;
      }
      (epd1->type).value = value;
      epd1->exponent = iVar2;
      return;
    }
    if ((long)((ulong)value ^ (ulong)epd1->type) < 0) {
      return;
    }
  }
  (epd1->type).value = -NAN;
  epd1->exponent = 0;
  return;
}

Assistant:

void
EpdSubtract(EpDouble *epd1, double value)
{
  EpDouble      epd2;
  double        tmp;
  int           exponent, diff;

  if (EpdIsNan(epd1) || IsNanDouble(value)) {
    EpdMakeNan(epd1);
    return;
  } else if (EpdIsInf(epd1) || IsInfDouble(value)) {
    int sign;

    EpdConvert(value, &epd2);
    if (EpdIsInf(epd1) && IsInfDouble(value)) {
      sign = epd1->type.bits.sign ^ epd2.type.bits.sign;
      if (sign == 0)
        EpdMakeNan(epd1);
    } else if (EpdIsInf(&epd2)) {
      EpdCopy(&epd2, epd1);
    }
    return;
  }

  assert(epd1->type.bits.exponent == EPD_MAX_BIN);

  EpdConvert(value, &epd2);
  if (epd1->exponent > epd2.exponent) {
    diff = epd1->exponent - epd2.exponent;
    if (diff <= EPD_MAX_BIN)
      tmp = epd1->type.value - epd2.type.value / pow((double)2.0, (double)diff);
    else
      tmp = epd1->type.value;
    exponent = epd1->exponent;
  } else if (epd1->exponent < epd2.exponent) {
    diff = epd2.exponent - epd1->exponent;
    if (diff <= EPD_MAX_BIN)
      tmp = epd1->type.value / pow((double)2.0, (double)diff) - epd2.type.value;
    else
      tmp = epd2.type.value * (double)(-1.0);
    exponent = epd2.exponent;
  } else {
    tmp = epd1->type.value - epd2.type.value;
    exponent = epd1->exponent;
  }
  epd1->type.value = tmp;
  epd1->exponent = exponent;
  EpdNormalize(epd1);
}